

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O0

Abc_Cex_t * Saig_ManCexMinPerform(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  uint uVar1;
  int iVar2;
  Vec_Vec_t *p;
  Aig_Man_t *pMan;
  char *pFileName;
  Vec_Vec_t *vFrameReas;
  Aig_Man_t *pManNew;
  Abc_Cex_t *pCexMin;
  int fReasonPi;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  p = Saig_ManCexMinComputeReason(pAig,pCex,0);
  uVar1 = Vec_VecSizeSize(p);
  iVar2 = Vec_VecSizeSize(p);
  printf("Reason size = %d.  Ave = %d.\n",(ulong)uVar1,
         (long)iVar2 / (long)(pCex->iFrame + 1) & 0xffffffff);
  pMan = Saig_ManCexMinDupWithCubes(pAig,p);
  Ioa_WriteAiger(pMan,"aigcube.aig",0,0);
  Aig_ManStop(pMan);
  printf("Intermediate AIG is written into file \"%s\".\n","aigcube.aig");
  Vec_VecFree(p);
  return (Abc_Cex_t *)0x0;
}

Assistant:

Abc_Cex_t * Saig_ManCexMinPerform( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    int fReasonPi = 0;

    Abc_Cex_t * pCexMin = NULL;
    Aig_Man_t * pManNew = NULL;
    Vec_Vec_t * vFrameReas;
    vFrameReas = Saig_ManCexMinComputeReason( pAig, pCex, fReasonPi );
    printf( "Reason size = %d.  Ave = %d.\n", Vec_VecSizeSize(vFrameReas), Vec_VecSizeSize(vFrameReas)/(pCex->iFrame + 1) );

    // try reducing the frames
    if ( !fReasonPi )
    {
        char * pFileName = "aigcube.aig";
        pManNew = Saig_ManCexMinDupWithCubes( pAig, vFrameReas );
        Ioa_WriteAiger( pManNew, pFileName, 0, 0 );
        Aig_ManStop( pManNew );
        printf( "Intermediate AIG is written into file \"%s\".\n", pFileName );
    }

    // find reduced counter-example
    Vec_VecFree( vFrameReas );
    return pCexMin;
}